

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_x11.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ATimeUs AVar4;
  undefined8 uVar5;
  float dt;
  ATimeUs now;
  uint oldh;
  uint oldw;
  XEvent e;
  undefined1 local_100 [4];
  int num_visuals;
  XVisualInfo xvisual_info;
  undefined8 uStack_b8;
  EGLint num_config;
  EGLConfig config;
  uint local_a8;
  EGLint ver_maj;
  EGLint ver_min;
  ATimeUs last_paint;
  XVisualInfo *vinfo;
  Atom delete_message;
  XSetWindowAttributes winattrs;
  ATimeUs timestamp;
  char **argv_local;
  int argc_local;
  
  winattrs.cursor._4_4_ = aAppTime();
  _ver_min = (undefined8 *)0x0;
  ver_maj = 0;
  a__x11.display = (Display *)XOpenDisplay(0);
  if (a__x11.display == (Display *)0x0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0xff,"a__x11.display = XOpenDisplay(NULL)");
    aAppTerminate(-1);
  }
  eglBindAPI(0x30a2);
  a_app_egl_display = (EGLDisplay)eglGetDisplay(a__x11.display);
  if (a_app_egl_display == (EGLDisplay)0x0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x10e,"EGL_NO_DISPLAY != (a_app_egl_display = eglGetDisplay(a__x11.display))");
    aAppTerminate(-1);
  }
  iVar3 = eglInitialize(a_app_egl_display,(long)&config + 4,&local_a8);
  if (iVar3 == 0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x10f,"eglInitialize(a_app_egl_display, &ver_maj, &ver_min)");
    aAppTerminate(-1);
  }
  aAppDebugPrintf("EGL: version %d.%d",(ulong)config._4_4_,(ulong)local_a8);
  uVar5 = eglQueryString(a_app_egl_display,0x3054);
  aAppDebugPrintf("EGL: EGL_VERSION: \'%s\'",uVar5);
  uVar5 = eglQueryString(a_app_egl_display,0x3053);
  aAppDebugPrintf("EGL: EGL_VENDOR: \'%s\'",uVar5);
  uVar5 = eglQueryString(a_app_egl_display,0x308d);
  aAppDebugPrintf("EGL: EGL_CLIENT_APIS: \'%s\'",uVar5);
  uVar5 = eglQueryString(a_app_egl_display,0x3055);
  aAppDebugPrintf("EGL: EGL_EXTENSIONS: \'%s\'",uVar5);
  iVar3 = eglChooseConfig(a_app_egl_display,a__app_egl_config_attrs,&stack0xffffffffffffff48,1,
                          &xvisual_info.bits_per_rgb);
  if (iVar3 == 0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x11c,
                    "eglChooseConfig(a_app_egl_display, a__app_egl_config_attrs, &config, 1, &num_config)"
                   );
    aAppTerminate(-1);
  }
  if (xvisual_info.bits_per_rgb < 1) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x11e,"num_config > 0");
    aAppTerminate(-1);
  }
  memset(local_100,0,0x40);
  iVar3 = eglGetConfigAttrib(a_app_egl_display,uStack_b8,0x302e,&xvisual_info);
  if (iVar3 == 0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x123,
                    "eglGetConfigAttrib(a_app_egl_display, config, EGL_NATIVE_VISUAL_ID, (EGLint*)&xvisual_info.visualid)"
                   );
    aAppTerminate(-1);
  }
  _ver_min = (undefined8 *)XGetVisualInfo(a__x11.display,3,local_100,(long)&e + 0xbc);
  if (_ver_min == (undefined8 *)0x0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x126,
                    "vinfo = XGetVisualInfo(a__x11.display, VisualScreenMask | VisualIDMask, &xvisual_info, &num_visuals)"
                   );
    aAppTerminate(-1);
  }
  memset(&delete_message,0,0x70);
  winattrs.save_under = 0x3804f;
  winattrs._68_4_ = 0;
  winattrs.border_pixmap = 0;
  winattrs.border_pixel._0_4_ = 10;
  winattrs._88_8_ =
       XCreateColormap(a__x11.display,
                       *(undefined8 *)
                        (*(long *)(a__x11.display + 0xe8) + (long)*(int *)(_ver_min + 2) * 0x80 +
                        0x10),*_ver_min,0);
  winattrs.do_not_propagate_mask._0_4_ = 0;
  a__x11.window =
       XCreateWindow(a__x11.display,
                     *(undefined8 *)
                      (*(long *)(a__x11.display + 0xe8) + (long)*(int *)(_ver_min + 2) * 0x80 + 0x10
                      ),0,0,0x500,0x2d0,0,*(undefined4 *)((long)_ver_min + 0x14),1,*_ver_min,0x2818,
                     &delete_message);
  if (a__x11.window == 0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x136,"a__x11.window");
    aAppTerminate(-1);
  }
  XStoreName(a__x11.display,a__x11.window,"atto app");
  vinfo = (XVisualInfo *)XInternAtom(a__x11.display,"WM_DELETE_WINDOW",1);
  XSetWMProtocols(a__x11.display,a__x11.window,&vinfo,1);
  XMapWindow(a__x11.display,a__x11.window);
  XkbSetDetectableAutoRepeat(a__x11.display,1,0);
  a__app_egl.context =
       (EGLContext)eglCreateContext(a_app_egl_display,uStack_b8,0,a__app_egl_context_attrs);
  if (a__app_egl.context == (EGLContext)0x0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x149,"EGL_NO_CONTEXT != a__app_egl.context");
    aAppTerminate(-1);
  }
  a__app_egl.surface =
       (EGLSurface)eglCreateWindowSurface(a_app_egl_display,uStack_b8,a__x11.window,0);
  if (a__app_egl.surface == (EGLSurface)0x0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x14d,"EGL_NO_SURFACE != a__app_egl.surface");
    aAppTerminate(-1);
  }
  iVar3 = eglMakeCurrent(a_app_egl_display,a__app_egl.surface,a__app_egl.surface,a__app_egl.context)
  ;
  if (iVar3 == 0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",
                    0x150,
                    "eglMakeCurrent(a_app_egl_display, a__app_egl.surface, a__app_egl.surface, a__app_egl.context)"
                   );
    aAppTerminate(-1);
  }
  XSelectInput(a__x11.display,a__x11.window,0x2004f);
  a__app_state.gl_version = AOGLV_21;
  a__app_state.width = 0x500;
  a__app_state.height = 0x2d0;
  a__app_state.argc = argc;
  a__app_state.argv = argv;
  attoAppInit(&a__app_proctable);
  AVar4 = ver_maj;
  if (a__app_proctable.resize != (_func_void_ATimeUs_uint_uint *)0x0) {
    (*a__app_proctable.resize)(winattrs.cursor._4_4_,0,0);
    AVar4 = ver_maj;
  }
  do {
    while (ver_maj = AVar4, iVar3 = XPending(a__x11.display), iVar3 == 0) {
      AVar4 = aAppTime();
      if (ver_maj == 0) {
        ver_maj = AVar4;
      }
      if (a__app_proctable.paint != (_func_void_ATimeUs_float *)0x0) {
        (*a__app_proctable.paint)(AVar4,(float)(AVar4 - ver_maj) * 1e-06);
      }
      iVar3 = eglSwapBuffers(a_app_egl_display,a__app_egl.surface);
      if (iVar3 == 0) {
        aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c"
                        ,0x18d,"eglSwapBuffers(a_app_egl_display, a__app_egl.surface)");
        aAppTerminate(-1);
      }
    }
    XNextEvent(a__x11.display,&oldh);
    uVar2 = a__app_state.height;
    uVar1 = a__app_state.width;
    switch(oldh) {
    case 2:
    case 3:
      a__appProcessXKeyEvent((XEvent *)&oldh);
      break;
    case 4:
    case 5:
      a__appProcessXButton((XEvent *)&oldh);
      break;
    case 6:
      a__appProcessXMotion((XEvent *)&oldh);
      break;
    case 0x11:
    case 0x12:
    case 0x21:
      if (a__app_proctable.close != (_func_void *)0x0) {
        (*a__app_proctable.close)();
      }
      aAppDebugPrintf("cleaning up");
      if (a_app_egl_display == (EGLDisplay)0x0) {
        aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c"
                        ,0x19d,"a_app_egl_display != EGL_NO_DISPLAY");
        aAppTerminate(-1);
      }
      eglTerminate(a_app_egl_display);
      XDestroyWindow(a__x11.display,a__x11.window);
      XCloseDisplay(a__x11.display);
      return 0;
    case 0x16:
      if ((a__app_state.width != e.xexpose.width) || (a__app_state.height != e.xexpose.height)) {
        a__app_state.width = e.xexpose.width;
        a__app_state.height = e.xexpose.height;
        winattrs.cursor._4_4_ = aAppTime();
        if (a__app_proctable.resize != (_func_void_ATimeUs_uint_uint *)0x0) {
          (*a__app_proctable.resize)(winattrs.cursor._4_4_,uVar1,uVar2);
        }
      }
    }
    AVar4 = ver_maj;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
	ATimeUs timestamp = aAppTime();
	XSetWindowAttributes winattrs;
	Atom delete_message;
#ifndef ATTO_EGL
	int nglxconfigs = 0;
	GLXFBConfig *glxconfigs = NULL;
#endif
	XVisualInfo *vinfo = NULL;
	ATimeUs last_paint = 0;

	ATTO_ASSERT(a__x11.display = XOpenDisplay(NULL));

#ifndef ATTO_EGL
	ATTO_ASSERT(glxconfigs = glXChooseFBConfig(a__x11.display, 0, a__glxattribs, &nglxconfigs));
	ATTO_ASSERT(nglxconfigs);

	ATTO_ASSERT(vinfo = glXGetVisualFromFBConfig(a__x11.display, glxconfigs[0]));

#else
	EGLint ver_min, ver_maj;
	EGLConfig config;
	EGLint num_config;

	eglBindAPI(EGL_OPENGL_API);

	ATTO_ASSERT(EGL_NO_DISPLAY != (a_app_egl_display = eglGetDisplay(a__x11.display)));
	ATTO_ASSERT(eglInitialize(a_app_egl_display, &ver_maj, &ver_min));

	aAppDebugPrintf("EGL: version %d.%d", ver_maj, ver_min);
	aAppDebugPrintf("EGL: EGL_VERSION: '%s'",
		eglQueryString(a_app_egl_display, EGL_VERSION));
	aAppDebugPrintf("EGL: EGL_VENDOR: '%s'",
		eglQueryString(a_app_egl_display, EGL_VENDOR));
	aAppDebugPrintf("EGL: EGL_CLIENT_APIS: '%s'",
		eglQueryString(a_app_egl_display, EGL_CLIENT_APIS));
	aAppDebugPrintf("EGL: EGL_EXTENSIONS: '%s'",
		eglQueryString(a_app_egl_display, EGL_EXTENSIONS));

	ATTO_ASSERT(eglChooseConfig(a_app_egl_display, a__app_egl_config_attrs,
		&config, 1, &num_config));

	ATTO_ASSERT(num_config > 0);

	{
		XVisualInfo xvisual_info = {0};
		int num_visuals;
		ATTO_ASSERT(eglGetConfigAttrib(a_app_egl_display, config, EGL_NATIVE_VISUAL_ID, (EGLint*)&xvisual_info.visualid));
		//xvisual_info.screen = DefaultScreen(a__x11.display);

		ATTO_ASSERT(vinfo = XGetVisualInfo(a__x11.display, VisualScreenMask | VisualIDMask, &xvisual_info, &num_visuals));
	}
#endif // ATTO_EGL

	memset(&winattrs, 0, sizeof(winattrs));
	winattrs.event_mask = KeyPressMask | KeyReleaseMask | ButtonPressMask | ButtonReleaseMask | PointerMotionMask |
		ExposureMask | VisibilityChangeMask | StructureNotifyMask;
	winattrs.border_pixel = 0;
	winattrs.bit_gravity = StaticGravity;
	winattrs.colormap =
		XCreateColormap(a__x11.display, RootWindow(a__x11.display, vinfo->screen), vinfo->visual, AllocNone);
	winattrs.override_redirect = False;

	a__x11.window =
		XCreateWindow(a__x11.display, RootWindow(a__x11.display, vinfo->screen), 0, 0, ATTO_APP_WIDTH, ATTO_APP_HEIGHT, 0,
			vinfo->depth, InputOutput, vinfo->visual, CWBorderPixel | CWBitGravity | CWEventMask | CWColormap, &winattrs);
	ATTO_ASSERT(a__x11.window);

	XStoreName(a__x11.display, a__x11.window, ATTO_APP_NAME);

	delete_message = XInternAtom(a__x11.display, "WM_DELETE_WINDOW", True);
	XSetWMProtocols(a__x11.display, a__x11.window, &delete_message, 1);

	XMapWindow(a__x11.display, a__x11.window);

	XkbSetDetectableAutoRepeat(a__x11.display, True, NULL);

#ifndef ATTO_EGL
	ATTO_ASSERT(a__x11.context = glXCreateNewContext(a__x11.display, glxconfigs[0], GLX_RGBA_TYPE, 0, True));
	ATTO_ASSERT(a__x11.drawable = glXCreateWindow(a__x11.display, glxconfigs[0], a__x11.window, 0));

	glXMakeContextCurrent(a__x11.display, a__x11.drawable, a__x11.drawable, a__x11.context);
#else
	a__app_egl.context = eglCreateContext(a_app_egl_display, config,
		EGL_NO_CONTEXT, a__app_egl_context_attrs);
	ATTO_ASSERT(EGL_NO_CONTEXT != a__app_egl.context);

	a__app_egl.surface = eglCreateWindowSurface(a_app_egl_display, config, a__x11.window, 0);
	//a__app_egl.surface = eglCreatePlatformWindowSurface(a_app_egl_display, config, &native_window, 0);
	ATTO_ASSERT(EGL_NO_SURFACE != a__app_egl.surface);

	ATTO_ASSERT(eglMakeCurrent(a_app_egl_display, a__app_egl.surface,
		a__app_egl.surface, a__app_egl.context));
#endif // !ATTO_EGL

	XSelectInput(a__x11.display, a__x11.window,
		StructureNotifyMask | KeyPressMask | KeyReleaseMask | ButtonPressMask | ButtonReleaseMask | PointerMotionMask);
	a__app_state.argc = argc;
	a__app_state.argv = (const char *const *)argv;
	a__app_state.gl_version = AOGLV_21;
	a__app_state.width = ATTO_APP_WIDTH;
	a__app_state.height = ATTO_APP_HEIGHT;

	ATTO_APP_INIT_FUNC(&a__app_proctable);

	if (a__app_proctable.resize)
		a__app_proctable.resize(timestamp, 0, 0);

	for (;;) {
		while (XPending(a__x11.display)) {
			XEvent e;
			XNextEvent(a__x11.display, &e);
			switch (e.type) {
			case ConfigureNotify: {
				unsigned int oldw = a__app_state.width, oldh = a__app_state.height;

				if (a__app_state.width == (unsigned int)e.xconfigure.width &&
					a__app_state.height == (unsigned int)e.xconfigure.height)
					break;

				a__app_state.width = e.xconfigure.width;
				a__app_state.height = e.xconfigure.height;
				timestamp = aAppTime();

				if (a__app_proctable.resize)
					a__app_proctable.resize(timestamp, oldw, oldh);
			} break;

			case ButtonPress:
			case ButtonRelease: a__appProcessXButton(&e); break;
			case MotionNotify: a__appProcessXMotion(&e); break;
			case KeyPress:
			case KeyRelease: a__appProcessXKeyEvent(&e); break;

			case ClientMessage:
			case DestroyNotify:
			case UnmapNotify: goto exit; break;
			}
		}

		{
			ATimeUs now = aAppTime();
			float dt;
			if (!last_paint)
				last_paint = now;
			dt = (now - last_paint) * 1e-6f;

			if (a__app_proctable.paint)
				a__app_proctable.paint(now, dt);

#ifndef ATTO_EGL
			glXSwapBuffers(a__x11.display, a__x11.drawable);
#else
			ATTO_ASSERT(eglSwapBuffers(a_app_egl_display, a__app_egl.surface));
#endif
			last_paint = now;
		}
	}

exit:
	if (a__app_proctable.close)
		a__app_proctable.close();

	aAppDebugPrintf("cleaning up");
#ifndef ATTO_EGL
	glXMakeContextCurrent(a__x11.display, 0, 0, 0);
	glXDestroyWindow(a__x11.display, a__x11.drawable);
	glXDestroyContext(a__x11.display, a__x11.context);
#else
	ATTO_ASSERT(a_app_egl_display != EGL_NO_DISPLAY);
	eglTerminate(a_app_egl_display);
#endif
	XDestroyWindow(a__x11.display, a__x11.window);
	XCloseDisplay(a__x11.display);

	return 0;
}